

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scv.c
# Opt level: O1

int scv_replace(scv_vector *v,size_t i,size_t j,void *data,size_t nobj)

{
  undefined1 auVar1 [16];
  int iVar2;
  long lVar3;
  size_t sVar4;
  
  if (v == (scv_vector *)0x0) {
    __assert_fail("v != NULL","/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/scv.c"
                  ,0x14d,
                  "int scv_replace(struct scv_vector *, size_t, size_t, const void *, size_t)");
  }
  if (v->data != (void *)0x0) {
    iVar2 = -3;
    if ((i <= j) && (j <= v->size)) {
      if (v->objsize == 0) {
        __assert_fail("v->objsize > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/scv.c",0x154,
                      "int scv_replace(struct scv_vector *, size_t, size_t, const void *, size_t)");
      }
      auVar1._8_8_ = 0;
      auVar1._0_8_ = v->objsize;
      lVar3 = v->size - (j - i);
      if (nobj < (ulong)(SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar1,0) -
                        lVar3)) {
        sVar4 = lVar3 + nobj;
        if ((v->capacity < sVar4) && (iVar2 = scv_i_grow(v,sVar4), iVar2 != 0)) {
          return iVar2;
        }
        lVar3 = v->size - j;
        if ((j <= v->size && lVar3 != 0) && (nobj + i != j)) {
          sVar4 = v->objsize;
          memmove((void *)((nobj + i) * sVar4 + (long)v->data),(void *)(j * sVar4 + (long)v->data),
                  lVar3 * sVar4);
        }
        if (nobj != 0 && data != (void *)0x0) {
          memcpy((void *)(i * v->objsize + (long)v->data),data,v->objsize * nobj);
        }
        v->size = v->size + (nobj - (j - i));
        iVar2 = 0;
      }
    }
    return iVar2;
  }
  __assert_fail("v->data != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/scv.c",0x14e,
                "int scv_replace(struct scv_vector *, size_t, size_t, const void *, size_t)");
}

Assistant:

int scv_replace(struct scv_vector *v, size_t i, size_t j, const void *data, size_t nobj)
{
	assert(v != NULL);
	assert(v->data != NULL);

	if (i > j || j > v->size) {
		return SCV_ERANGE;
	}

	assert(v->objsize > 0);

	if (nobj >= (size_t) -1 / v->objsize - (v->size - (j - i))) {
		return SCV_ERANGE;
	}

	if (v->size - (j - i) + nobj > v->capacity) {
		int res = scv_i_grow(v, v->size - (j - i) + nobj);

		if (res != SCV_OK) {
			return res;
		}
	}

	if (j < v->size && i + nobj != j) {
		memmove(SCV_AT(v, i + nobj), SCV_AT(v, j), (v->size - j) * v->objsize);
	}

	if (data != NULL && nobj > 0) {
		memcpy(SCV_AT(v, i), data, nobj * v->objsize);
	}

	v->size = v->size - (j - i) + nobj;

	return SCV_OK;
}